

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

XML_Char * poolCopyString(STRING_POOL *pool,XML_Char *s)

{
  char cVar1;
  char *pcVar2;
  XML_Char *pXVar3;
  int iVar4;
  
  while ((pool->ptr != pool->end || (iVar4 = poolGrow(pool), iVar4 != 0))) {
    cVar1 = *s;
    pcVar2 = pool->ptr;
    pool->ptr = pcVar2 + 1;
    *pcVar2 = cVar1;
    cVar1 = *s;
    s = s + 1;
    if (cVar1 == '\0') {
      pXVar3 = pool->start;
      pool->start = pool->ptr;
      return pXVar3;
    }
  }
  return (XML_Char *)0x0;
}

Assistant:

static const XML_Char *poolCopyString(STRING_POOL *pool, const XML_Char *s)
{
  do {
    if (!poolAppendChar(pool, *s))
      return 0;
  } while (*s++);
  s = pool->start;
  poolFinish(pool);
  return s;
}